

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O1

void __thiscall
perfetto::SharedMemoryArbiterImpl::ReleaseWriterID(SharedMemoryArbiterImpl *this,WriterID id)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  element_type *ppSVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  int iVar4;
  _Base_ptr p_Var5;
  iterator __position;
  TaskRunner *pTVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  bool bVar7;
  undefined8 *local_48;
  undefined8 uStack_40;
  code *local_38;
  code *pcStack_30;
  
  iVar4 = pthread_mutex_lock((pthread_mutex_t *)&this->lock_);
  if (iVar4 == 0) {
    IdAllocatorGeneric::FreeGeneric(&(this->active_writer_ids_).super_IdAllocatorGeneric,(uint)id);
    p_Var1 = &(this->pending_writers_)._M_t._M_impl.super__Rb_tree_header;
    p_Var5 = (_Base_ptr)p_Var1;
    for (p_Var2 = (_Base_ptr)
                  (this->pending_writers_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var2 != (_Base_ptr)0x0; p_Var2 = (&p_Var2->_M_left)[bVar7]) {
      bVar7 = (ushort)(short)p_Var2[1]._M_color < id;
      if (!bVar7) {
        p_Var5 = p_Var2;
      }
    }
    __position._M_node = (_Base_ptr)p_Var1;
    if (((_Rb_tree_header *)p_Var5 != p_Var1) &&
       (__position._M_node = p_Var5, id < (ushort)(short)p_Var5[1]._M_color)) {
      __position._M_node = (_Base_ptr)p_Var1;
    }
    if ((_Rb_tree_header *)__position._M_node == p_Var1) {
      pTVar6 = this->task_runner_;
      bVar7 = pTVar6 != (TaskRunner *)0x0;
    }
    else {
      ::std::
      _Rb_tree<unsigned_short,std::pair<unsigned_short_const,unsigned_int>,std::_Select1st<std::pair<unsigned_short_const,unsigned_int>>,std::less<unsigned_short>,std::allocator<std::pair<unsigned_short_const,unsigned_int>>>
      ::erase_abi_cxx11_((_Rb_tree<unsigned_short,std::pair<unsigned_short_const,unsigned_int>,std::_Select1st<std::pair<unsigned_short_const,unsigned_int>>,std::less<unsigned_short>,std::allocator<std::pair<unsigned_short_const,unsigned_int>>>
                          *)&this->pending_writers_,__position);
      pTVar6 = (TaskRunner *)0x0;
      bVar7 = false;
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->lock_);
    if (bVar7) {
      ppSVar3 = (this->weak_ptr_factory_).weak_ptr_.handle_.
                super___shared_ptr<perfetto::SharedMemoryArbiterImpl_*,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr;
      this_00 = (this->weak_ptr_factory_).weak_ptr_.handle_.
                super___shared_ptr<perfetto::SharedMemoryArbiterImpl_*,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_00->_M_use_count = this_00->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_00->_M_use_count = this_00->_M_use_count + 1;
        }
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            this_00->_M_use_count = this_00->_M_use_count + 1;
            UNLOCK();
          }
          else {
            this_00->_M_use_count = this_00->_M_use_count + 1;
          }
        }
      }
      local_38 = (code *)0x0;
      pcStack_30 = (code *)0x0;
      local_48 = (undefined8 *)0x0;
      uStack_40 = 0;
      local_48 = (undefined8 *)operator_new(0x18);
      *local_48 = ppSVar3;
      local_48[1] = this_00;
      *(WriterID *)(local_48 + 2) = id;
      pcStack_30 = std::
                   _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc:39150:25)>
                   ::_M_invoke;
      local_38 = std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc:39150:25)>
                 ::_M_manager;
      (*pTVar6->_vptr_TaskRunner[2])(pTVar6);
      if (local_38 != (code *)0x0) {
        (*local_38)(&local_48,&local_48,3);
      }
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
    }
    return;
  }
  ::std::__throw_system_error(iVar4);
}

Assistant:

void SharedMemoryArbiterImpl::ReleaseWriterID(WriterID id) {
  base::TaskRunner* task_runner = nullptr;
  {
    std::lock_guard<std::mutex> scoped_lock(lock_);
    active_writer_ids_.Free(id);

    auto it = pending_writers_.find(id);
    if (it != pending_writers_.end()) {
      // Writer hasn't been bound yet and thus also not yet registered with the
      // service.
      pending_writers_.erase(it);
      return;
    }

    // A trace writer from an aborted session may be destroyed before the
    // arbiter is bound to a task runner. In that case, it was never registered
    // with the service.
    if (!task_runner_)
      return;

    task_runner = task_runner_;
  }  // scoped_lock

  // We shouldn't post tasks while locked. |task_runner| remains valid after
  // unlocking, because |task_runner_| is never reset.
  auto weak_this = weak_ptr_factory_.GetWeakPtr();
  task_runner->PostTask([weak_this, id] {
    if (weak_this)
      weak_this->producer_endpoint_->UnregisterTraceWriter(id);
  });
}